

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

void __thiscall Bitmap::setPixelValue(Bitmap *this,int32_t pixel,bool value)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  
  if ((uint)pixel < (uint)this->length) {
    bVar2 = (byte)pixel & 7;
    iVar4 = pixel + 7;
    if (-1 < pixel) {
      iVar4 = pixel;
    }
    bVar1 = this->data[iVar4 >> 3];
    bVar3 = (byte)(-0x81 >> bVar2) & bVar1;
    if (value) {
      bVar3 = (byte)(0x80 >> bVar2) | bVar1;
    }
    this->data[iVar4 >> 3] = bVar3;
  }
  return;
}

Assistant:

void Bitmap::setPixelValue(const int32_t pixel, const bool value)
{
   const int32_t index = pixel / 8;
   const uint8_t mask = (0x80 >> (pixel & 7));
   uint8_t data;

   //ignore all pixel that does not fit onto the lable
   if ((uint32_t)pixel < this->length)
   {
      //set pixel value by read-modify-write
      //read respective byte
      data = this->data[index];
      //modify respective bit
      if (value == false)
      {
         data = data & ~mask; //clear
      }
      else
      {
         data = data | mask; //clear
      }
      //write back respective byte
      this->data[index] = data;
   }
}